

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

UDate __thiscall
icu_63::CalendarAstronomer::getSunTime(CalendarAstronomer *this,double desired,UBool next)

{
  UDate UVar1;
  SunTimeAngleFunc func;
  AngleFunc local_8;
  
  local_8._vptr_AngleFunc = (_func_int **)&PTR_eval_003ed3e8;
  UVar1 = timeOfAngle(this,&local_8,desired,365.242191,60000.0,next);
  return UVar1;
}

Assistant:

UDate CalendarAstronomer::getSunTime(double desired, UBool next)
{
    SunTimeAngleFunc func;
    return timeOfAngle( func,
                        desired,
                        TROPICAL_YEAR,
                        MINUTE_MS,
                        next);
}